

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMapping.h
# Opt level: O0

void __thiscall Diligent::IResourceMapping::IResourceMapping(IResourceMapping *this)

{
  IResourceMapping *this_local;
  
  IObject::IObject(&this->super_IObject);
  (this->super_IObject)._vptr_IObject = (_func_int **)&PTR___cxa_pure_virtual_01399b70;
  return;
}

Assistant:

DILIGENT_BEGIN_INTERFACE(IResourceMapping, IObject)
{
    /// Adds a resource to the mapping.

    /// \param [in] Name - Resource name.
    /// \param [in] pObject - Pointer to the object.
    /// \param [in] bIsUnique - Flag indicating if a resource with the same name
    ///                         is allowed to be found in the mapping. In the latter
    ///                         case, the new resource replaces the existing one.
    ///
    /// \remarks Resource mapping increases the reference counter for referenced objects. So an
    ///          object will not be released as long as it is in the resource mapping.
    VIRTUAL void METHOD(AddResource)(THIS_
                                     const Char*    Name,
                                     IDeviceObject* pObject,
                                     Bool           bIsUnique) PURE;


    /// Adds resource array to the mapping.

    /// \param [in] Name - Resource array name.
    /// \param [in] StartIndex - First index in the array, where the first element will be inserted
    /// \param [in] ppObjects - Pointer to the array of objects.
    /// \param [in] NumElements - Number of elements to add
    /// \param [in] bIsUnique - Flag indicating if a resource with the same name
    ///                         is allowed to be found in the mapping. In the latter
    ///                         case, the new resource replaces the existing one.
    ///
    /// \remarks Resource mapping increases the reference counter for referenced objects. So an
    ///          object will not be released as long as it is in the resource mapping.
    VIRTUAL void METHOD(AddResourceArray)(THIS_
                                          const Char*           Name,
                                          Uint32                StartIndex,
                                          IDeviceObject* const* ppObjects,
                                          Uint32                NumElements,
                                          Bool                  bIsUnique) PURE;


    /// Removes a resource from the mapping using its literal name.

    /// \param [in] Name - Name of the resource to remove.
    /// \param [in] ArrayIndex - For array resources, index in the array
    VIRTUAL void METHOD(RemoveResourceByName)(THIS_
                                              const Char* Name,
                                              Uint32      ArrayIndex DEFAULT_VALUE(0)) PURE;

    /// Finds a resource in the mapping.

    /// \param [in] Name        - Resource name.
    /// \param [in] ArrayIndex  - for arrays, index of the array element.
    ///
    /// \return Pointer to the object with the given name and array index.
    ///
    /// \remarks The method does **NOT** increase the reference counter
    ///          of the returned object, so Release() **must not** be called.
    ///          The pointer is guaranteed to be valid until the object is removed
    ///          from the resource mapping, or the mapping is destroyed.
    VIRTUAL IDeviceObject* METHOD(GetResource)(THIS_
                                               const Char* Name,
                                               Uint32      ArrayIndex DEFAULT_VALUE(0)) PURE;

    /// Returns the size of the resource mapping, i.e. the number of objects.
    VIRTUAL size_t METHOD(GetSize)(THIS) PURE;
}